

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall QDockAreaLayoutInfo::setTabBarShape(QDockAreaLayoutInfo *this,int shape)

{
  QDockAreaLayoutInfo *this_00;
  pointer pQVar1;
  long lVar2;
  ulong uVar3;
  
  if (this->tabBarShape != shape) {
    this->tabBarShape = shape;
    if (this->tabBar != (QTabBar *)0x0) {
      QTabBar::setShape(this->tabBar,shape);
    }
    if ((this->item_list).d.size != 0) {
      lVar2 = 8;
      uVar3 = 0;
      do {
        pQVar1 = QList<QDockAreaLayoutItem>::data(&this->item_list);
        this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar1->widgetItem + lVar2);
        if (this_00 != (QDockAreaLayoutInfo *)0x0) {
          setTabBarShape(this_00,shape);
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x28;
      } while (uVar3 < (ulong)(this->item_list).d.size);
    }
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::setTabBarShape(int shape)
{
    if (shape == tabBarShape)
        return;
    tabBarShape = shape;
    if (tabBar != nullptr)
        tabBar->setShape(static_cast<QTabBar::Shape>(shape));

    for (int i = 0; i < item_list.size(); ++i) {
        QDockAreaLayoutItem &item = item_list[i];
        if (item.subinfo != nullptr)
            item.subinfo->setTabBarShape(shape);
    }
}